

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O3

boolean lookup_id_mapping(uint gid,uint *nidp)

{
  bucket **ppbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bucket *pbVar5;
  
  if ((n_ids_mapped != 0) && (id_map != (bucket *)0x0)) {
    uVar4 = 0x40;
    pbVar5 = id_map;
    if (n_ids_mapped % 0x40 != 0) {
      uVar4 = (ulong)(uint)(n_ids_mapped % 0x40);
    }
    do {
      uVar2 = 0x40;
      if (pbVar5 == id_map) {
        uVar2 = uVar4;
      }
      while (uVar3 = uVar2, 0 < (int)uVar3) {
        uVar2 = uVar3 - 1;
        if (pbVar5->map[uVar3 - 1].gid == gid) {
          *nidp = pbVar5->map[uVar3 - 1].nid;
          return '\x01';
        }
      }
      ppbVar1 = &pbVar5->next;
      pbVar5 = *ppbVar1;
    } while (*ppbVar1 != (bucket *)0x0);
  }
  return '\0';
}

Assistant:

boolean lookup_id_mapping(unsigned gid, unsigned *nidp)
{
    int i;
    struct bucket *curr;

    if (n_ids_mapped)
	for (curr = id_map; curr; curr = curr->next) {
	    /* first bucket might not be totally full */
	    if (curr == id_map) {
		i = n_ids_mapped % N_PER_BUCKET;
		if (i == 0) i = N_PER_BUCKET;
	    } else
		i = N_PER_BUCKET;

	    while (--i >= 0)
		if (gid == curr->map[i].gid) {
		    *nidp = curr->map[i].nid;
		    return TRUE;
		}
	}

    return FALSE;
}